

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void units::addUnitFlagStrings(precise_unit *un,string *unitString)

{
  bool bVar1;
  unit_data uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  precise_unit *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  unit_data in_stack_ffffffffffffffe4;
  unit_data in_stack_ffffffffffffffe8;
  
  uVar2 = precise_unit::base_units(in_RDI);
  bVar1 = detail::unit_data::has_i_flag((unit_data *)&stack0xffffffffffffffec);
  if (bVar1) {
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x784ed6);
    if (bVar1) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                in_stack_ffffffffffffffd8);
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (in_RSI,(char *)CONCAT44(uVar2,in_stack_ffffffffffffffe8));
    }
  }
  precise_unit::base_units(in_RDI);
  bVar1 = detail::unit_data::has_e_flag((unit_data *)&stack0xffffffffffffffe8);
  if (bVar1) {
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x784f2a);
    if (bVar1) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                in_stack_ffffffffffffffd8);
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                (unaff_retaddr,(size_type)in_RDI,(char *)in_RSI);
    }
  }
  uVar2 = precise_unit::base_units(in_RDI);
  bVar1 = detail::unit_data::is_per_unit((unit_data *)&stack0xffffffffffffffe4);
  if (bVar1) {
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x784f82);
    if (bVar1) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(uVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                (unaff_retaddr,(size_type)in_RDI,(char *)in_RSI);
    }
  }
  return;
}

Assistant:

static void addUnitFlagStrings(const precise_unit& un, std::string& unitString)
{
    if (un.base_units().has_i_flag()) {
        if (unitString.empty()) {
            unitString = "flag";
        } else {
            unitString.append("*flag");
        }
    }
    if (un.base_units().has_e_flag()) {
        if (unitString.empty()) {
            unitString = "eflag";
        } else {
            unitString.insert(0, "eflag*");
        }
    }
    if (un.base_units().is_per_unit()) {
        if (unitString.empty()) {
            unitString = "pu";
        } else {
            unitString.insert(0, "pu*");
        }
    }
}